

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O1

Range<wchar_t> __thiscall
Centaurus::CharClass<wchar_t>::operator[](CharClass<wchar_t> *this,int index)

{
  ulong uVar1;
  long lVar2;
  ulong in_RDX;
  undefined4 in_register_00000034;
  Range<wchar_t> RVar3;
  Range<wchar_t> RVar4;
  
  if (-1 < (int)in_RDX) {
    uVar1 = in_RDX & 0xffffffff;
    in_RDX = *(ulong *)(CONCAT44(in_register_00000034,index) + 8);
    if (uVar1 < (ulong)((long)(*(long *)(CONCAT44(in_register_00000034,index) + 0x10) - in_RDX) >> 4
                       )) {
      lVar2 = uVar1 * 0x10;
      this->_vptr_CharClass = (_func_int **)&PTR__Range_0019f5a8;
      *(undefined4 *)
       &(this->m_ranges).
        super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
        _M_impl.super__Vector_impl_data._M_start = *(undefined4 *)(in_RDX + 8 + lVar2);
      *(undefined4 *)
       ((long)&(this->m_ranges).
               super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 4) =
           *(undefined4 *)(in_RDX + 0xc + lVar2);
      RVar3.m_start = (int)in_RDX;
      RVar3.m_end = (int)(in_RDX >> 0x20);
      RVar3._vptr_Range = (_func_int **)this;
      return RVar3;
    }
  }
  this->_vptr_CharClass = (_func_int **)&PTR__Range_0019f5a8;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  RVar4.m_start = (int)in_RDX;
  RVar4.m_end = (int)(in_RDX >> 0x20);
  RVar4._vptr_Range = (_func_int **)this;
  return RVar4;
}

Assistant:

Range<TCHAR> operator[](int index) const
    {
        if (index >= 0 && index < m_ranges.size())
            return m_ranges[index];
        return Range<TCHAR>();
    }